

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

bool __thiscall google::protobuf::Symbol::IsVisibleFrom(Symbol *this,FileDescriptor *other)

{
  uint8_t uVar1;
  bool bVar2;
  SymbolVisibility SVar3;
  FileDescriptor *pFVar4;
  bool bVar5;
  
  pFVar4 = GetFile(this);
  bVar5 = false;
  if ((other != (FileDescriptor *)0x0) && (bVar5 = false, pFVar4 != (FileDescriptor *)0x0)) {
    uVar1 = this->ptr_->symbol_type_;
    bVar5 = true;
    if ((uVar1 == '\x04') || (uVar1 == '\x01')) {
      bVar2 = is_placeholder(this);
      if (!bVar2) {
        pFVar4 = GetFile(this);
        if (pFVar4 != other) {
          SVar3 = GetEffectiveVisibility(this);
          bVar5 = SVar3 == VISIBILITY_EXPORT;
        }
      }
    }
  }
  return bVar5;
}

Assistant:

bool IsVisibleFrom(FileDescriptor* other) const {
    if (GetFile() == nullptr || other == nullptr) {
      return false;
    }

    // Only Types (message/enum) have visibility.
    if (!IsType()) {
      return true;
    }

    // If we're dealing with a placeholder then just stop now, visibility can't
    // be determined and we have to rely on the proto-compiler previously having
    // checked the validity.
    if (is_placeholder()) {
      return true;
    }

    if (GetFile() == other) {
      return true;
    }

    SymbolVisibility effective_visibility = GetEffectiveVisibility();

    return effective_visibility == SymbolVisibility::VISIBILITY_EXPORT;
  }